

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<unsigned_char,false,false>
          (uchar min_value,uchar max_value)

{
  byte in_SIL;
  uchar value;
  bitpacking_width_t bitwidth;
  undefined8 uStack_8;
  
  if (in_SIL == 0) {
    uStack_8._7_1_ = '\0';
  }
  else {
    uStack_8 = (ulong)in_SIL << 0x18;
    while (uStack_8._3_1_ != '\0') {
      uStack_8._0_4_ = ((int)((uint)uStack_8 >> 0x18) >> 1) << 0x18;
      uStack_8 = (ulong)CONCAT14(uStack_8._4_1_ + '\x01',(uint)uStack_8);
    }
    uStack_8._7_1_ = GetEffectiveWidth<unsigned_char>(uStack_8._4_1_);
  }
  return uStack_8._7_1_;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}